

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O0

bool __thiscall draco::PointCloud::DeduplicateAttributeValues(PointCloud *this)

{
  ValueType VVar1;
  int32_t iVar2;
  PointCloud *in_RDI;
  int32_t att_id;
  int32_t in_stack_ffffffffffffffcc;
  PointCloud *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  int local_14;
  
  VVar1 = num_points(in_RDI);
  if (VVar1 != 0) {
    local_14 = 0;
    while (iVar3 = local_14, iVar2 = num_attributes((PointCloud *)0x1c79be), iVar3 < iVar2) {
      in_stack_ffffffffffffffd0 =
           (PointCloud *)attribute(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      attribute(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      VVar1 = PointAttribute::DeduplicateValues
                        ((PointAttribute *)in_RDI,
                         (GeometryAttribute *)CONCAT44(iVar3,in_stack_ffffffffffffffd8));
      if (VVar1 == 0) {
        return false;
      }
      local_14 = local_14 + 1;
    }
  }
  return true;
}

Assistant:

bool PointCloud::DeduplicateAttributeValues() {
  // Go over all attributes and create mapping between duplicate entries.
  if (num_points() == 0) {
    return true;  // Nothing to deduplicate.
  }
  // Deduplicate all attributes.
  for (int32_t att_id = 0; att_id < num_attributes(); ++att_id) {
    if (!attribute(att_id)->DeduplicateValues(*attribute(att_id))) {
      return false;
    }
  }
  return true;
}